

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType1::operator==(GridDataType1 *this,GridDataType1 *Value)

{
  undefined1 *puVar1;
  float fVar2;
  pointer __s1;
  pointer puVar3;
  pointer __s2;
  KBOOL KVar4;
  int iVar5;
  size_t __n;
  
  KVar4 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if (!KVar4) {
    fVar2 = *(float *)&(this->super_GridData).field_0xc;
    puVar1 = &(Value->super_GridData).field_0xc;
    if ((fVar2 == *(float *)puVar1) && (!NAN(fVar2) && !NAN(*(float *)puVar1))) {
      if (((float)this->m_f32FieldOffset == (float)Value->m_f32FieldOffset) &&
         ((!NAN((float)this->m_f32FieldOffset) && !NAN((float)Value->m_f32FieldOffset) &&
          (this->m_ui16NumValues == Value->m_ui16NumValues)))) {
        __s1 = (this->m_vui16Values).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
        puVar3 = (this->m_vui16Values).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __n = (long)puVar3 - (long)__s1;
        __s2 = (Value->m_vui16Values).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
        if (__n == (long)(Value->m_vui16Values).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)__s2) {
          if (puVar3 != __s1) {
            iVar5 = bcmp(__s1,__s2,__n);
            return iVar5 == 0;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL GridDataType1::operator == ( const GridDataType1 & Value ) const
{
    if( GridData::operator != ( Value ) )            return false;
    if( m_f32FieldScale  != Value.m_f32FieldScale )  return false;
    if( m_f32FieldOffset != Value.m_f32FieldOffset ) return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues )  return false;
    if( m_vui16Values    != Value.m_vui16Values )    return false;
    return true;
}